

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess.cpp
# Opt level: O0

void __thiscall
trun::SubProcess::Start(SubProcess *this,Ref *library,Ref *useModule,string *ipcName)

{
  element_type *this_00;
  undefined1 local_70 [56];
  thread local_38;
  undefined8 local_30;
  string *local_28;
  string *ipcName_local;
  Ref *useModule_local;
  Ref *library_local;
  SubProcess *this_local;
  
  local_28 = ipcName;
  ipcName_local = (string *)useModule;
  useModule_local = (Ref *)library;
  library_local = (Ref *)this;
  std::shared_ptr<trun::TestModule>::operator=
            ((shared_ptr<trun::TestModule> *)(this + 0x58),useModule);
  local_30 = std::chrono::_V2::system_clock::now();
  *(undefined8 *)(this + 0x68) = local_30;
  this_00 = std::__shared_ptr_access<trun::TestModule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<trun::TestModule,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)(this + 0x58));
  TestModule::ChangeState(this_00,Executing);
  local_70._0_8_ = this;
  std::shared_ptr<trun::IDynLibrary>::shared_ptr
            ((shared_ptr<trun::IDynLibrary> *)(local_70 + 8),
             (shared_ptr<trun::IDynLibrary> *)useModule_local);
  std::__cxx11::string::string((string *)(local_70 + 0x18),local_28);
  std::thread::
  thread<trun::SubProcess::Start(std::shared_ptr<trun::IDynLibrary>const&,std::shared_ptr<trun::TestModule>,std::__cxx11::string_const&)::__0,,void>
            (&local_38,(type *)local_70);
  std::thread::operator=((thread *)(this + 0x50),&local_38);
  std::thread::~thread(&local_38);
  Start(std::shared_ptr<trun::IDynLibrary>const&,std::shared_ptr<trun::TestModule>,std::__cxx11::string_const&)
  ::$_0::~__0((__0 *)local_70);
  return;
}

Assistant:

void SubProcess::Start(const IDynLibrary::Ref &library, TestModule::Ref useModule, const std::string &ipcName) {
    // Save this locally, we need to update the state
    module = std::move(useModule);

    // Need to do this before spinning up the thread...
    tStart = pclock::now();

    module->ChangeState(TestModule::kState::Executing);

    // Note: CAN'T USE REFERENCES - they will change before capture actually takes place..
    thread = std::thread([this, library, ipcName]() {
        state = SubProcessState::kRunning;

        //
        // TO-DO
        //  - Forward certain config settings (like; -G/-D/-r/-c/-C
        //
        std::string optionals = {};
        if (!Config::Instance().testGlobalMain) optionals += "G";
        if (!Config::Instance().linuxUseDeepBinding) optionals += "D";
        if (!Config::Instance().skipOnModuleFail) optionals += "c";
        if (!Config::Instance().stopOnAllFail) optionals += "C";

        proc = new Process(Config::Instance().appName);
        proc->SetCallback(&dataHandler);
        name = module->name;
        if(!optionals.empty()) {
            optionals = "-" + optionals;
            proc->AddArgument(optionals);
        }

        proc->AddArgument("--sequential");  // otherwise we would fork ourselves
        proc->AddArgument("--subprocess");  // hidden; telling trun it's running as a sub-process
        proc->AddArgument("--ipc-name");    // hidden; telling trun which IPC FIFO file name it should use
        proc->AddArgument(ipcName);
        proc->AddArgument("-m");            // Append the module
        proc->AddArgument(module->name);
        proc->AddArgument(library->Name());
        wasProcessExecOk = proc->ExecuteAndWait();
        state = SubProcessState::kFinished;
        exitStatus = proc->GetExitStatus();
    });

}